

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
MatcherBase<const_std::tuple<const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&>_&>
::~MatcherBase(MatcherBase<const_std::tuple<const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&>_&>
               *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }